

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::AddLocalMinPoly(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *pt)

{
  bool bVar1;
  long64 lVar2;
  long64 lVar3;
  TEdge *local_38;
  TEdge *prevE;
  TEdge *e;
  IntPoint *pt_local;
  TEdge *e2_local;
  TEdge *e1_local;
  Clipper *this_local;
  
  if (((-1e-20 < e2->dx - -1e+40) && (e2->dx - -1e+40 < 1e-20)) ||
     (e2->dx <= e1->dx && e1->dx != e2->dx)) {
    AddOutPt(this,e1,pt);
    e2->outIdx = e1->outIdx;
    e1->side = esLeft;
    e2->side = esRight;
    prevE = e1;
    if (e1->prevInAEL == e2) {
      local_38 = e2->prevInAEL;
    }
    else {
      local_38 = e1->prevInAEL;
    }
  }
  else {
    AddOutPt(this,e2,pt);
    e1->outIdx = e2->outIdx;
    e1->side = esRight;
    e2->side = esLeft;
    prevE = e2;
    if (e2->prevInAEL == e1) {
      local_38 = e1->prevInAEL;
    }
    else {
      local_38 = e2->prevInAEL;
    }
  }
  if ((local_38 != (TEdge *)0x0) && (-1 < local_38->outIdx)) {
    lVar2 = TopX(local_38,pt->Y);
    lVar3 = TopX(prevE,pt->Y);
    if ((lVar2 == lVar3) &&
       (bVar1 = SlopesEqual(prevE,local_38,
                            (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                         [(long)&(this->m_PolyOuts).
                                                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                         ] & 1)), bVar1)) {
      AddJoin(this,prevE,local_38,-1,-1);
    }
  }
  return;
}

Assistant:

void Clipper::AddLocalMinPoly(TEdge *e1, TEdge *e2, const IntPoint &pt)
{
  TEdge *e, *prevE;
  if( NEAR_EQUAL(e2->dx, HORIZONTAL) || ( e1->dx > e2->dx ) )
  {
    AddOutPt( e1, pt );
    e2->outIdx = e1->outIdx;
    e1->side = esLeft;
    e2->side = esRight;
    e = e1;
    if (e->prevInAEL == e2)
      prevE = e2->prevInAEL; 
    else
      prevE = e->prevInAEL;
  } else
  {
    AddOutPt( e2, pt );
    e1->outIdx = e2->outIdx;
    e1->side = esRight;
    e2->side = esLeft;
    e = e2;
    if (e->prevInAEL == e1)
        prevE = e1->prevInAEL;
    else
        prevE = e->prevInAEL;
  }
  if (prevE && prevE->outIdx >= 0 &&
      (TopX(*prevE, pt.Y) == TopX(*e, pt.Y)) &&
        SlopesEqual(*e, *prevE, m_UseFullRange))
          AddJoin(e, prevE, -1, -1);
}